

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O3

void multiply(features *f_dest,features *f_src2,interact *in)

{
  vw *pvVar1;
  ulong uVar2;
  ulong i;
  ulong uVar3;
  float *pfVar4;
  ulong i_00;
  float *pfVar5;
  ostream *poVar6;
  float *pfVar7;
  uint64_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  features::clear(f_dest);
  pvVar1 = in->all;
  puVar8 = &(pvVar1->weights).dense_weights._weight_mask;
  if ((pvVar1->weights).sparse != false) {
    puVar8 = &(pvVar1->weights).sparse_weights._weight_mask;
  }
  uVar2 = *puVar8;
  i = *(in->feat_store).indicies._begin;
  uVar3 = *(f_src2->indicies)._begin;
  features::push_back(f_dest,*(in->feat_store).values._begin * *(f_src2->values)._begin,i);
  pfVar5 = (in->feat_store).values._begin;
  pfVar7 = (in->feat_store).values._end;
  if (4 < (ulong)((long)pfVar7 - (long)pfVar5)) {
    uVar12 = 1;
    uVar9 = 1;
    uVar10 = 0;
    uVar11 = 0;
    do {
      pfVar4 = (f_src2->values)._begin;
      if ((ulong)((long)(f_src2->values)._end - (long)pfVar4 >> 2) <= uVar12) {
        return;
      }
      i_00 = (in->feat_store).indicies._begin[uVar9];
      uVar13 = (i_00 & uVar2) - (i & uVar2) & uVar2;
      if ((uVar13 < uVar11) ||
         (uVar11 = ((f_src2->indicies)._begin[uVar12] & uVar2) - (uVar3 & uVar2) & uVar2,
         uVar11 < uVar10)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"interact features are out of order: ",0x24);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," < ",3);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,". Skipping features.",0x14);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        return;
      }
      if (uVar13 == uVar11) {
        features::push_back(f_dest,pfVar5[uVar9] * pfVar4[uVar12],i_00);
        uVar9 = uVar9 + 1;
        uVar12 = uVar12 + 1;
        pfVar5 = (in->feat_store).values._begin;
        pfVar7 = (in->feat_store).values._end;
      }
      else if (uVar13 < uVar11) {
        uVar9 = uVar9 + 1;
      }
      else {
        uVar12 = uVar12 + 1;
      }
      uVar10 = uVar11;
      uVar11 = uVar13;
    } while (uVar9 < (ulong)((long)pfVar7 - (long)pfVar5 >> 2));
  }
  return;
}

Assistant:

void multiply(features& f_dest, features& f_src2, interact& in)
{
  f_dest.clear();
  features& f_src1 = in.feat_store;
  vw* all = in.all;
  uint64_t weight_mask = all->weights.mask();
  uint64_t base_id1 = f_src1.indicies[0] & weight_mask;
  uint64_t base_id2 = f_src2.indicies[0] & weight_mask;

  f_dest.push_back(f_src1.values[0] * f_src2.values[0], f_src1.indicies[0]);

  uint64_t prev_id1 = 0;
  uint64_t prev_id2 = 0;

  for (size_t i1 = 1, i2 = 1; i1 < f_src1.size() && i2 < f_src2.size();)
  {
    // calculating the relative offset from the namespace offset used to match features
    uint64_t cur_id1 = (uint64_t)(((f_src1.indicies[i1] & weight_mask) - base_id1) & weight_mask);
    uint64_t cur_id2 = (uint64_t)(((f_src2.indicies[i2] & weight_mask) - base_id2) & weight_mask);

    // checking for sorting requirement
    if (cur_id1 < prev_id1)
    {
      cout << "interact features are out of order: " << cur_id1 << " < " << prev_id1 << ". Skipping features." << endl;
      return;
    }

    if (cur_id2 < prev_id2)
    {
      cout << "interact features are out of order: " << cur_id2 << " < " << prev_id2 << ". Skipping features." << endl;
      return;
    }

    if (cur_id1 == cur_id2)
    {
      f_dest.push_back(f_src1.values[i1] * f_src2.values[i2], f_src1.indicies[i1]);
      i1++;
      i2++;
    }
    else if (cur_id1 < cur_id2)
      i1++;
    else
      i2++;
    prev_id1 = cur_id1;
    prev_id2 = cur_id2;
  }
}